

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

void __thiscall
QToolBarAreaLayoutInfo::moveToolBar(QToolBarAreaLayoutInfo *this,QToolBar *toolbar,int pos)

{
  QToolBarAreaLayoutItem *this_00;
  QToolBarAreaLayoutItem *this_01;
  Orientation OVar1;
  QToolBarAreaLayoutItem *pQVar2;
  QLayoutItem *pQVar3;
  Representation RVar4;
  int iVar5;
  int iVar6;
  pointer pQVar7;
  QList<QToolBarAreaLayoutItem> *this_02;
  pointer pQVar8;
  QToolBar *pQVar9;
  QSize QVar10;
  pointer pQVar11;
  QSize QVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  QToolBarAreaLayoutItem *pQVar20;
  uint local_64;
  int local_58;
  
  if (this->dirty == true) {
    fitLayout(this);
  }
  this->dirty = true;
  iVar15 = 0;
  if (this->o == Vertical) {
    iVar15 = (this->rect).y1.m_i;
  }
  if ((this->lines).d.size != 0) {
    iVar15 = pos - iVar15;
    uVar14 = 0;
    do {
      pQVar7 = QList<QToolBarAreaLayoutLine>::data(&this->lines);
      if (pQVar7[uVar14].toolBarItems.d.size != 0) {
        this_02 = &pQVar7[uVar14].toolBarItems;
        lVar13 = 0;
        local_64 = 0xffffffff;
        uVar19 = 0;
        local_58 = 0;
        do {
          pQVar8 = QList<QToolBarAreaLayoutItem>::data(this_02);
          pQVar20 = (QToolBarAreaLayoutItem *)((long)&pQVar8->widgetItem + lVar13);
          pQVar9 = (QToolBar *)
                   (**(code **)(**(long **)((long)&pQVar8->widgetItem + lVar13) + 0x68))();
          if (pQVar9 == toolbar) {
            if ((int)local_64 < 0) {
              return;
            }
            pQVar11 = QList<QToolBarAreaLayoutItem>::data(this_02);
            this_00 = pQVar11 + local_64;
            iVar5 = *(int *)((long)&pQVar8->pos + lVar13);
            if (iVar15 < iVar5) {
              if (local_58 < iVar15) {
                local_58 = iVar15;
              }
            }
            else {
              local_58 = (this->rect).y2.m_i - (this->rect).y1.m_i;
              if (this->o == Horizontal) {
                local_58 = (this->rect).x2.m_i - (this->rect).x1.m_i;
              }
              local_58 = local_58 + 1;
              lVar16 = lVar13;
              if ((uVar19 & 0xffffffff) < (ulong)pQVar7[uVar14].toolBarItems.d.size) {
                do {
                  pQVar2 = pQVar7[uVar14].toolBarItems.d.ptr;
                  this_01 = (QToolBarAreaLayoutItem *)((long)&pQVar2->widgetItem + lVar16);
                  if (((&pQVar2->gap)[lVar16] != false) ||
                     ((pQVar3 = this_01->widgetItem, pQVar3 != (QLayoutItem *)0x0 &&
                      (iVar5 = (*pQVar3->_vptr_QLayoutItem[8])(), (char)iVar5 == '\0')))) {
                    OVar1 = this->o;
                    QVar10 = QToolBarAreaLayoutItem::minimumSize(this_01);
                    RVar4 = QVar10.ht.m_i;
                    if (OVar1 == Horizontal) {
                      RVar4 = QVar10.wd.m_i;
                    }
                    local_58 = local_58 - RVar4.m_i;
                  }
                  uVar19 = uVar19 + 1;
                  lVar16 = lVar16 + 0x18;
                } while (uVar19 < (ulong)pQVar7[uVar14].toolBarItems.d.size);
                iVar5 = *(int *)((long)&pQVar8->pos + lVar13);
              }
              if (iVar15 < local_58) {
                local_58 = iVar15;
              }
            }
            OVar1 = this->o;
            QVar12 = QToolBarAreaLayoutItem::sizeHint(this_00);
            QVar10 = (QSize)((ulong)QVar12 >> 0x20);
            if (OVar1 == Horizontal) {
              QVar10 = QVar12;
            }
            iVar18 = QVar10.wd.m_i.m_i - (this_00->size + (local_58 - iVar5));
            iVar15 = -iVar18;
            if (0 < iVar18) {
              iVar15 = iVar18;
            }
            iVar6 = QApplication::startDragDistance();
            iVar17 = 0;
            if (iVar15 < iVar6) {
              iVar17 = iVar18;
            }
            iVar17 = iVar17 + (local_58 - iVar5);
            iVar15 = -iVar17;
            QToolBarAreaLayoutItem::extendSize(pQVar20,pQVar7[uVar14].o,iVar15);
            if (iVar17 < 0) {
              iVar5 = local_64 + 1;
              lVar13 = (ulong)local_64 * 0x18;
              do {
                pQVar8 = QList<QToolBarAreaLayoutItem>::data(this_02);
                pQVar20 = (QToolBarAreaLayoutItem *)((long)&pQVar8->widgetItem + lVar13);
                if (((&pQVar8->gap)[lVar13] != false) ||
                   ((pQVar20->widgetItem != (QLayoutItem *)0x0 &&
                    (iVar18 = (*pQVar20->widgetItem->_vptr_QLayoutItem[8])(), (char)iVar18 == '\0'))
                   )) {
                  OVar1 = this->o;
                  QVar12 = QToolBarAreaLayoutItem::minimumSize(pQVar20);
                  QVar10 = (QSize)((ulong)QVar12 >> 0x20);
                  if (OVar1 == Horizontal) {
                    QVar10 = QVar12;
                  }
                  iVar18 = *(int *)((long)&pQVar8->size + lVar13) - QVar10.wd.m_i;
                  iVar17 = iVar15 - iVar18;
                  if (iVar17 == 0 || iVar15 < iVar18) {
                    QToolBarAreaLayoutItem::extendSize(pQVar20,pQVar7[uVar14].o,-iVar15);
                    iVar15 = 0;
                  }
                  else {
                    QToolBarAreaLayoutItem::resize(pQVar20,pQVar7[uVar14].o,QVar10.wd.m_i.m_i);
                    iVar15 = iVar17;
                  }
                }
                iVar5 = iVar5 + -1;
                lVar13 = lVar13 + -0x18;
              } while (0 < iVar5);
              return;
            }
            QToolBarAreaLayoutItem::extendSize(this_00,pQVar7[uVar14].o,iVar17);
            return;
          }
          if (((&pQVar8->gap)[lVar13] != false) ||
             ((pQVar20->widgetItem != (QLayoutItem *)0x0 &&
              (iVar5 = (*pQVar20->widgetItem->_vptr_QLayoutItem[8])(), (char)iVar5 == '\0')))) {
            OVar1 = this->o;
            QVar10 = QToolBarAreaLayoutItem::minimumSize(pQVar20);
            RVar4 = QVar10.ht.m_i;
            if (OVar1 == Horizontal) {
              RVar4 = QVar10.wd.m_i;
            }
            local_58 = local_58 + RVar4.m_i;
            local_64 = (uint)uVar19;
          }
          uVar19 = uVar19 + 1;
          lVar13 = lVar13 + 0x18;
        } while (uVar19 < (ulong)pQVar7[uVar14].toolBarItems.d.size);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < (ulong)(this->lines).d.size);
  }
  return;
}

Assistant:

void QToolBarAreaLayoutInfo::moveToolBar(QToolBar *toolbar, int pos)
{
    if (dirty)
        fitLayout();

    dirty = true;

    if (o == Qt::Vertical)
        pos -= rect.top();

    //here we actually update the preferredSize for the line containing the toolbar so that we move it
    for (int j = 0; j < lines.size(); ++j) {
        QToolBarAreaLayoutLine &line = lines[j];

        int previousIndex = -1;
        int minPos = 0;
        for (int k = 0; k < line.toolBarItems.size(); ++k) {
            QToolBarAreaLayoutItem &current = line.toolBarItems[k];
            if (current.widgetItem->widget() == toolbar) {
                int newPos = current.pos;

                if (previousIndex >= 0) {
                    QToolBarAreaLayoutItem &previous = line.toolBarItems[previousIndex];
                    if (pos < current.pos) {
                        newPos = qMax(pos, minPos);
                    } else {
                        //we check the max value for the position (until everything at the right is "compressed")
                        int maxPos = pick(o, rect.size());
                        for(int l = k; l < line.toolBarItems.size(); ++l) {
                            const QToolBarAreaLayoutItem &item = line.toolBarItems.at(l);
                            if (!item.skip()) {
                                maxPos -= pick(o, item.minimumSize());
                            }
                        }
                        newPos = qMin(pos, maxPos);
                    }

                    //extra is the number of pixels to add to the previous toolbar
                    int extra = newPos - current.pos;

                    //we check if the previous is near its size hint
                    //in which case we try to stick to it
                    const int diff = pick(o, previous.sizeHint()) - (previous.size + extra);
                    if (qAbs(diff) < QApplication::startDragDistance()) {
                        //we stick to the default place and size
                        extra += diff;
                    }

                    //update for the current item
                    current.extendSize(line.o, -extra);

                    if (extra >= 0) {
                        previous.extendSize(line.o, extra);
                    } else {
                        //we need to push the toolbars on the left starting with previous
                        extra = -extra; // we just need to know the number of pixels
                        ///at this point we need to get extra pixels from the toolbars at the left
                        for(int l = previousIndex; l >=0; --l) {
                            QToolBarAreaLayoutItem &item = line.toolBarItems[l];
                            if (!item.skip()) {
                                const int minPreferredSize = pick(o, item.minimumSize());
                                const int margin =  item.size - minPreferredSize;
                                if (margin < extra) {
                                    item.resize(line.o, minPreferredSize);
                                    extra -= margin;
                                } else {
                                    item.extendSize(line.o, -extra);
                                    extra = 0;
                                }
                            }
                        }
                        Q_ASSERT(extra == 0);
                    }
                } else {
                    //the item is the first one, it should be at position 0
                }

                return;

            } else if (!current.skip()) {
                previousIndex = k;
                minPos += pick(o, current.minimumSize());
            }
        }
    }
}